

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PackageImportDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageImportDeclarationSyntax,slang::syntax::PackageImportDeclarationSyntax_const&>
          (BumpAllocator *this,PackageImportDeclarationSyntax *args)

{
  PackageImportDeclarationSyntax *this_00;
  
  this_00 = (PackageImportDeclarationSyntax *)allocate(this,0xa8,8);
  slang::syntax::PackageImportDeclarationSyntax::PackageImportDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }